

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

string_view __thiscall bloaty::RangeSink::TranslateVMToFile(RangeSink *this,uint64_t address)

{
  bool bVar1;
  Arg *in_R8;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  string_view format;
  uint64_t translated;
  string local_60;
  Arg local_40;
  
  if (this->translator_ == (DualMap *)0x0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x55b,"std::string_view bloaty::RangeSink::TranslateVMToFile(uint64_t)");
  }
  bVar1 = RangeMap::Translate(&this->translator_->vm_map,address,&translated);
  if (bVar1) {
    local_40.piece_._M_len = (this->file_->data_)._M_len;
    if (translated <= local_40.piece_._M_len) {
      local_40.piece_._M_str = (this->file_->data_)._M_str;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&local_40.piece_,translated,0xffffffffffffffff);
      sVar3._M_len = bVar2._M_len;
      sVar3._M_str = bVar2._M_str;
      return sVar3;
    }
  }
  absl::substitute_internal::Arg::Arg(&local_40,address);
  format._M_str = (char *)&local_40;
  format._M_len = (size_t)"Can\'t translate VM pointer ($0) to file";
  absl::Substitute_abi_cxx11_(&local_60,(absl *)0x27,format,in_R8);
  Throw(local_60._M_dataplus._M_p,0x55f);
}

Assistant:

std::string_view RangeSink::TranslateVMToFile(uint64_t address) {
  assert(translator_);
  uint64_t translated;
  if (!translator_->vm_map.Translate(address, &translated) ||
      translated > file_->data().size()) {
    THROWF("Can't translate VM pointer ($0) to file", address);

  }
  return file_->data().substr(translated);
}